

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeWindowsListByBeginStackParent
               (ImGuiWindow **windows,int windows_size,ImGuiWindow *parent_in_begin_stack)

{
  char local_48 [8];
  char buf [20];
  ImGuiWindow *window;
  int i;
  ImGuiWindow *parent_in_begin_stack_local;
  int windows_size_local;
  ImGuiWindow **windows_local;
  
  for (window._4_4_ = 0; window._4_4_ < windows_size; window._4_4_ = window._4_4_ + 1) {
    unique0x00012000 = windows[window._4_4_];
    if (unique0x00012000->ParentWindowInBeginStack == parent_in_begin_stack) {
      ImFormatString(local_48,0x14,"[%04d] Window",
                     (ulong)(uint)(int)unique0x00012000->BeginOrderWithinContext);
      DebugNodeWindow(stack0xffffffffffffffd0,local_48);
      Indent(0.0);
      DebugNodeWindowsListByBeginStackParent
                (windows + (long)window._4_4_ + 1,(windows_size - window._4_4_) + -1,
                 stack0xffffffffffffffd0);
      Unindent(0.0);
    }
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindowsListByBeginStackParent(ImGuiWindow** windows, int windows_size, ImGuiWindow* parent_in_begin_stack)
{
    for (int i = 0; i < windows_size; i++)
    {
        ImGuiWindow* window = windows[i];
        if (window->ParentWindowInBeginStack != parent_in_begin_stack)
            continue;
        char buf[20];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "[%04d] Window", window->BeginOrderWithinContext);
        //BulletText("[%04d] Window '%s'", window->BeginOrderWithinContext, window->Name);
        DebugNodeWindow(window, buf);
        Indent();
        DebugNodeWindowsListByBeginStackParent(windows + i + 1, windows_size - i - 1, window);
        Unindent();
    }
}